

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

void __thiscall
QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::insertRow
          (FixedColumnMatrix<QFormLayoutItem_*,_2> *this,int r,QFormLayoutItem **value)

{
  iterator iVar1;
  
  iVar1 = QList<QFormLayoutItem_*>::begin(&this->m_storage);
  QList<QFormLayoutItem_*>::insert(&this->m_storage,(const_iterator)(iVar1.i + r * 2),2,*value);
  return;
}

Assistant:

void FixedColumnMatrix<T, NumColumns>::insertRow(int r, const T &value)
{
    typename Storage::iterator it = m_storage.begin();
    it += r * NumColumns;
    m_storage.insert(it, NumColumns, value);
}